

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_extension_size(nifti_image *nim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  if (nim == (nifti_image *)0x0) {
    return 0;
  }
  iVar3 = nim->num_ext;
  if (iVar3 < 1) {
    return 0;
  }
  if (2 < g_opts_0) {
    fwrite("-d ext sizes:",0xd,1,_stderr);
    iVar3 = nim->num_ext;
    if (iVar3 < 1) {
      uVar4 = 0;
      iVar2 = g_opts_0;
      goto LAB_00110937;
    }
  }
  lVar6 = 0;
  lVar5 = 0;
  uVar4 = 0;
  iVar2 = g_opts_0;
  do {
    uVar1 = *(uint *)((long)&nim->ext_list->esize + lVar6);
    if (2 < iVar2) {
      fprintf(_stderr,"  %d",(ulong)uVar1);
      iVar3 = nim->num_ext;
      iVar2 = g_opts_0;
    }
    uVar4 = uVar4 + uVar1;
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x10;
  } while (lVar5 < iVar3);
LAB_00110937:
  if (2 < iVar2) {
    fprintf(_stderr," (total = %d)\n",(ulong)uVar4);
  }
  return uVar4;
}

Assistant:

int nifti_extension_size(nifti_image *nim)
{
   int c, size = 0;

   if( !nim || nim->num_ext <= 0 ) return 0;

   if( g_opts.debug > 2 ) fprintf(stderr,"-d ext sizes:");

   for ( c = 0; c < nim->num_ext; c++ ){
      size += nim->ext_list[c].esize;
      if( g_opts.debug > 2 ) fprintf(stderr,"  %d",nim->ext_list[c].esize);
   }

   if( g_opts.debug > 2 ) fprintf(stderr," (total = %d)\n",size);

   return size;
}